

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity.c
# Opt level: O1

void unittest_error(gravity_vm *vm,error_type_t error_type,char *message,error_desc_t error_desc,
                   void *xdata)

{
  char *pcVar1;
  unittest_data *data;
  
  if (*xdata != '\0') {
    return;
  }
  *(undefined1 *)xdata = 1;
  if (error_type - GRAVITY_ERROR_SYNTAX < 5) {
    pcVar1 = &DAT_001415c8 +
             *(int *)(&DAT_001415c8 + (ulong)(error_type - GRAVITY_ERROR_SYNTAX) * 4);
  }
  else {
    pcVar1 = "NONE";
  }
  if (error_type == GRAVITY_ERROR_RUNTIME) {
    printf("\tRUNTIME ERROR: ",pcVar1);
  }
  else {
    printf("\t%s ERROR on %d (%d,%d): ",pcVar1,error_desc._8_8_ & 0xffffffff,
           error_desc._0_8_ & 0xffffffff,error_desc._0_8_ >> 0x20);
  }
  puts(message);
  if (*(char *)((long)xdata + 1) != '\x01') {
    if (((*(error_type_t *)((long)xdata + 0x10) != error_type) ||
        (*(uint32_t *)((long)xdata + 0x28) != 0xffffffff &&
         *(uint32_t *)((long)xdata + 0x28) != error_desc.lineno)) ||
       (*(uint32_t *)((long)xdata + 0x2c) != 0xffffffff &&
        *(uint32_t *)((long)xdata + 0x2c) != error_desc.colno)) {
      *(int *)((long)xdata + 0xc) = *(int *)((long)xdata + 0xc) + 1;
      pcVar1 = "\tFAILURE";
      goto LAB_0010aa30;
    }
  }
  *(int *)((long)xdata + 8) = *(int *)((long)xdata + 8) + 1;
  pcVar1 = "\tSUCCESS";
LAB_0010aa30:
  puts(pcVar1);
  return;
}

Assistant:

static void unittest_error (gravity_vm *vm, error_type_t error_type, const char *message, error_desc_t error_desc, void *xdata) {
    (void) vm;
    
    unittest_data *data = (unittest_data *)xdata;
    if (data->processed == true) return; // ignore 2nd error
    data->processed = true;
    
    const char *type = "NONE";
    if (error_type == GRAVITY_ERROR_SYNTAX) type = "SYNTAX";
    else if (error_type == GRAVITY_ERROR_SEMANTIC) type = "SEMANTIC";
    else if (error_type == GRAVITY_ERROR_RUNTIME) type = "RUNTIME";
    else if (error_type == GRAVITY_WARNING) type = "WARNING";
    
    if (error_type == GRAVITY_ERROR_RUNTIME) printf("\tRUNTIME ERROR: ");
    else printf("\t%s ERROR on %d (%d,%d): ", type, error_desc.fileid, error_desc.lineno, error_desc.colno);
    printf("%s\n", message);
    
    bool same_error = (data->expected_error == error_type);
    bool same_row = (data->expected_row != -1) ? (data->expected_row == error_desc.lineno) : true;
    bool same_col = (data->expected_col != -1) ? (data->expected_col == error_desc.colno) : true;
    
    if (data->is_fuzzy) {
        ++data->nsuccess;
        printf("\tSUCCESS\n");
        return;
    }
    
    if (same_error && same_row && same_col) {
        ++data->nsuccess;
        printf("\tSUCCESS\n");
    } else {
        ++data->nfailure;
        printf("\tFAILURE\n");
    }
}